

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::TypeName_abi_cxx11_(FieldDescriptor *field)

{
  Type TVar1;
  string *in_RDI;
  FieldDescriptor *in_stack_ffffffffffffff30;
  allocator *paVar2;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11 [17];
  
  TVar1 = FieldDescriptor::type(in_stack_ffffffffffffff30);
  switch(TVar1) {
  case TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"double",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"float",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case TYPE_INT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int64",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case TYPE_UINT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"uint64",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case TYPE_INT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int32",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
    break;
  case TYPE_FIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"fixed64",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case TYPE_FIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"fixed32",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"bool",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"string",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case TYPE_GROUP:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"group",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case TYPE_MESSAGE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"message",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case TYPE_BYTES:
    paVar2 = &local_33;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"bytes",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case TYPE_UINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"uint32",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case TYPE_ENUM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"enum",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case TYPE_SFIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"sfixed32",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case TYPE_SFIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"sfixed64",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case TYPE_SINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"sint32",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case MAX_TYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"sint64",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
  }
  return in_RDI;
}

Assistant:

std::string TypeName(const FieldDescriptor* field) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32: return "int32";
    case FieldDescriptor::TYPE_INT64: return "int64";
    case FieldDescriptor::TYPE_UINT32: return "uint32";
    case FieldDescriptor::TYPE_UINT64: return "uint64";
    case FieldDescriptor::TYPE_SINT32: return "sint32";
    case FieldDescriptor::TYPE_SINT64: return "sint64";
    case FieldDescriptor::TYPE_FIXED32: return "fixed32";
    case FieldDescriptor::TYPE_FIXED64: return "fixed64";
    case FieldDescriptor::TYPE_SFIXED32: return "sfixed32";
    case FieldDescriptor::TYPE_SFIXED64: return "sfixed64";
    case FieldDescriptor::TYPE_DOUBLE: return "double";
    case FieldDescriptor::TYPE_FLOAT: return "float";
    case FieldDescriptor::TYPE_BOOL: return "bool";
    case FieldDescriptor::TYPE_ENUM: return "enum";
    case FieldDescriptor::TYPE_STRING: return "string";
    case FieldDescriptor::TYPE_BYTES: return "bytes";
    case FieldDescriptor::TYPE_MESSAGE: return "message";
    case FieldDescriptor::TYPE_GROUP: return "group";
    default: assert(false); return "";
  }
}